

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

ListNode * list_remove(ListNode *node,CleanupListValue cleanup_value,void *cleanup_value_data)

{
  ListNode *pLVar1;
  
  if (node != (ListNode *)0x0) {
    pLVar1 = node->prev;
    pLVar1->next = node->next;
    node->next->prev = pLVar1;
    if (cleanup_value != (CleanupListValue)0x0) {
      (*cleanup_value)(node->value,cleanup_value_data);
    }
    return node;
  }
  cm_print_error("%s\n","node");
  _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
        ,0x27c);
}

Assistant:

static ListNode* list_remove(
        ListNode * const node, const CleanupListValue cleanup_value,
        void * const cleanup_value_data) {
    assert_non_null(node);
    node->prev->next = node->next;
    node->next->prev = node->prev;
    if (cleanup_value) {
        cleanup_value(node->value, cleanup_value_data);
    }
    return node;
}